

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)300>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Type *pTVar3;
  GLMRegressor *from;
  LogMessage *other;
  Type *pTVar4;
  int iVar5;
  int index;
  _Alloc_hider _Var6;
  ModelDescription *description;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  GLMRegressor lr;
  allocator_type local_109;
  _func_int **local_108;
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  Result *local_e0;
  string local_d8;
  undefined1 local_b8 [56];
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  undefined1 local_70 [24];
  int local_58;
  Model *local_38;
  
  description = format->description_;
  if (description == (ModelDescription *)0x0) {
    description = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateRegressorInterface((Result *)&local_108,description,format->specificationversion_);
  bVar2 = Result::good((Result *)&local_108);
  if (bVar2) {
    local_e0 = __return_storage_ptr__;
    local_38 = format;
    if (0 < (description->input_).super_RepeatedPtrFieldBase.current_size_) {
      iVar5 = 0;
      do {
        local_d8._M_dataplus._M_p = (pointer)0x500000002;
        local_d8._M_string_length._0_4_ = 1;
        __l._M_len = 3;
        __l._M_array = (iterator)&local_d8;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)local_b8,__l,&local_109);
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(description->input_).super_RepeatedPtrFieldBase,iVar5);
        validateSchemaTypes((Result *)local_80,
                            (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                             *)local_b8,pTVar3);
        local_108 = (_func_int **)local_80;
        std::__cxx11::string::operator=((string *)&local_100,(string *)&local_78);
        if (local_78._M_p != local_70 + 8) {
          operator_delete(local_78._M_p,CONCAT44(local_70._12_4_,local_70._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
        }
        bVar2 = Result::good((Result *)&local_108);
        __return_storage_ptr__ = local_e0;
        if (!bVar2) goto LAB_0027b99a;
        iVar5 = iVar5 + 1;
      } while (iVar5 < (description->input_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (0 < (description->output_).super_RepeatedPtrFieldBase.current_size_) {
      iVar5 = 0;
      do {
        local_d8._M_dataplus._M_p._0_4_ = 2;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&local_d8;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)local_b8,__l_00,&local_109);
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(description->output_).super_RepeatedPtrFieldBase,iVar5);
        validateSchemaTypes((Result *)local_80,
                            (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                             *)local_b8,pTVar3);
        local_108 = (_func_int **)local_80;
        std::__cxx11::string::operator=((string *)&local_100,(string *)&local_78);
        if (local_78._M_p != local_70 + 8) {
          operator_delete(local_78._M_p,CONCAT44(local_70._12_4_,local_70._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
        }
        bVar2 = Result::good((Result *)&local_108);
        __return_storage_ptr__ = local_e0;
        if (!bVar2) goto LAB_0027b99a;
        iVar5 = iVar5 + 1;
      } while (iVar5 < (description->output_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (local_38->_oneof_case_[0] == 300) {
      from = (local_38->Type_).glmregressor_;
    }
    else {
      from = Specification::GLMRegressor::default_instance();
    }
    __return_storage_ptr__ = local_e0;
    Specification::GLMRegressor::GLMRegressor((GLMRegressor *)local_80,from);
    if (local_70._8_4_ == local_58) {
      if (0 < (int)local_70._8_4_) {
        if ((int)local_70._8_4_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          other = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_b8,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d8,other);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b8);
        }
        if (1 < (int)local_70._8_4_) {
          iVar5 = *(int *)(*(long *)(local_70._16_8_ + 8) + 0x10);
          index = 1;
          do {
            pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                               ((RepeatedPtrFieldBase *)local_70,index);
            if ((pTVar4->value_).current_size_ != iVar5) {
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,"All weight coefficients must be the same size.","");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
              local_b8._16_8_ = local_d8.field_2._M_allocated_capacity;
              _Var6._M_p = local_d8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_0027bafe;
              goto LAB_0027bb06;
            }
            index = index + 1;
          } while (index < (int)local_70._8_4_);
        }
      }
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Weights and offsets must be the same size.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
      _Var6._M_p = (pointer)local_b8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_b8 + 0x10)) {
LAB_0027bafe:
        operator_delete(_Var6._M_p,(ulong)(local_b8._16_8_ + 1));
      }
    }
LAB_0027bb06:
    Specification::GLMRegressor::~GLMRegressor((GLMRegressor *)local_80);
  }
  else {
LAB_0027b99a:
    *(_func_int ***)__return_storage_ptr__ = local_108;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p == &local_f0) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_f0._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_100._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_f8;
    local_f8 = 0;
    local_f0._M_local_buf[0] = '\0';
    local_100._M_p = (pointer)&local_f0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_p != &local_f0) {
    operator_delete(local_100._M_p,
                    CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmRegressor>(const Specification::Model& format) {
        const Specification::ModelDescription& interface = format.description();

        // Must have a regressor interface (since GLMRegressor is an MLRegressor)
        Result result = validateRegressorInterface(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Check allowed output input & types are supported by this model.
        for (int i = 0; i < interface.input_size(); i++) {
            result = validateSchemaTypes({
                            Specification::FeatureType::kDoubleType,
                            Specification::FeatureType::kMultiArrayType,
                            Specification::FeatureType::kInt64Type
                      }, interface.input(i));
            if (!result.good()) {
                return result;
            }
        }
        for (int i = 0; i < interface.output_size(); i++) {
            result = validateSchemaTypes({
                Specification::FeatureType::kDoubleType,
            }, interface.output(i));

            if (!result.good()) {
                return result;
            }
        }
        
        // Linear regression specific type checking.
        // -------------------------------------------------------------------------
        auto lr = format.glmregressor();
        if (lr.weights_size() != lr.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Weights and offsets must be the same size.");
        }
        
        if (lr.weights_size() > 0) {
            int expected_size = lr.weights(0).value_size();
            for (int i = 1; i < lr.weights_size(); i++) {
                if (lr.weights(i).value_size() != expected_size) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "All weight coefficients must be the same size.");
                }
            }
        }
        return Result();
    }